

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__convert_16_to_8(stbi__uint16 *orig,int w,int h,int channels)

{
  int iVar1;
  stbi_uc *reduced;
  int local_28;
  int img_len;
  int i;
  int channels_local;
  int h_local;
  int w_local;
  stbi__uint16 *orig_local;
  
  iVar1 = w * h * channels;
  orig_local = (stbi__uint16 *)stbi__malloc((long)iVar1);
  if (orig_local == (stbi__uint16 *)0x0) {
    stbi__err("outofmem");
    orig_local = (stbi__uint16 *)0x0;
  }
  else {
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      *(char *)((long)orig_local + (long)local_28) = (char)(orig[local_28] >> 8);
    }
    free(orig);
  }
  return (stbi_uc *)orig_local;
}

Assistant:

static stbi_uc *stbi__convert_16_to_8(stbi__uint16 *orig, int w, int h, int channels)
{
   int i;
   int img_len = w * h * channels;
   stbi_uc *reduced;

   reduced = (stbi_uc *) stbi__malloc(img_len);
   if (reduced == NULL) return stbi__errpuc("outofmem", "Out of memory");

   for (i = 0; i < img_len; ++i)
      reduced[i] = (stbi_uc)((orig[i] >> 8) & 0xFF); // top half of each byte is sufficient approx of 16->8 bit scaling

   STBI_FREE(orig);
   return reduced;
}